

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O2

ebml_element *
EBML_ElementSkipData
          (ebml_element *p,stream *Input,ebml_parser_context *Context,ebml_element *TestReadElt,
          bool_t AllowDummyElt)

{
  code *pcVar1;
  uint __line;
  bool_t bVar2;
  ebml_element *Element;
  filepos_t fVar3;
  char *__assertion;
  int bUpperElement;
  
  bVar2 = EBML_ElementIsFiniteSize(p);
  if (bVar2 != 0) {
    if (TestReadElt == (ebml_element *)0x0) {
      if (p->ElementPosition < p->SizePosition) {
        if (Input != (stream *)0x0) {
          (**(code **)((long)(Input->Base).VMT + 0x78))(Input,p->EndPosition,0);
          return (ebml_element *)0x0;
        }
        __assertion = "(const void*)(Input)!=NULL";
        __line = 99;
      }
      else {
        __assertion = "p->ElementPosition < p->SizePosition";
        __line = 0x62;
      }
    }
    else {
      __assertion = "TestReadElt == NULL";
      __line = 0x61;
    }
LAB_00105286:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                  ,__line,
                  "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                 );
  }
  bUpperElement = 0;
  Element = EBML_FindNextElement(Input,Context,&bUpperElement,AllowDummyElt);
  if (Element != (ebml_element *)0x0) {
    if (Input == (stream *)0x0) {
      __assertion = "(const void*)(Input)!=NULL";
      __line = 0x69;
      goto LAB_00105286;
    }
    pcVar1 = *(code **)((long)(Input->Base).VMT + 0x78);
    fVar3 = EBML_ElementPositionData(Element);
    (*pcVar1)(Input,fVar3,0);
  }
  return Element;
}

Assistant:

ebml_element *EBML_ElementSkipData(ebml_element *p, struct stream *Input, const ebml_parser_context *Context, ebml_element *TestReadElt, bool_t AllowDummyElt)
{
    ebml_element *Result = NULL;
    if (EBML_ElementIsFiniteSize(p)) {
        assert(TestReadElt == NULL);
        assert(p->ElementPosition < p->SizePosition);
        Stream_Seek(Input, EBML_ElementPositionEnd(p), SEEK_SET);
    } else {
        // read elements until an upper element is found
        int bUpperElement = 0; // trick to call FindNextID correctly
        Result = EBML_FindNextElement(Input, Context, &bUpperElement, AllowDummyElt);
        if (Result != NULL)
            Stream_Seek(Input, EBML_ElementPositionData(Result), SEEK_SET);
    }
    return Result;
}